

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O3

void cid_size_done(FT_Size cidsize)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_Module pFVar3;
  long lVar4;
  CID_Size size;
  PSHinter_Service pshinter;
  
  if (cidsize->internal->module_data != (void *)0x0) {
    puVar1 = (undefined8 *)cidsize->face[2].bbox.yMin;
    pFVar3 = FT_Get_Module((cidsize->face->driver->root).library,"pshinter");
    if ((puVar1 != (undefined8 *)0x0 && pFVar3 != (FT_Module)0x0) &&
       (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) {
      lVar4 = (*pcVar2)(pFVar3);
      if (lVar4 != 0) {
        (**(code **)(lVar4 + 0x10))(cidsize->internal->module_data);
      }
    }
    cidsize->internal->module_data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cid_size_done( FT_Size  cidsize )         /* CID_Size */
  {
    CID_Size  size = (CID_Size)cidsize;


    if ( cidsize->internal->module_data )
    {
      PSH_Globals_Funcs  funcs;


      funcs = cid_size_get_globals_funcs( size );
      if ( funcs )
        funcs->destroy( (PSH_Globals)cidsize->internal->module_data );

      cidsize->internal->module_data = NULL;
    }
  }